

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_manager_impl.c
# Opt level: O1

loader_manager_impl loader_manager_impl_initialize(void)

{
  char cVar1;
  int iVar2;
  loader_manager_impl __ptr;
  vector pvVar3;
  set psVar4;
  vector pvVar5;
  undefined8 *puVar6;
  void *pvVar7;
  uint64_t uVar8;
  plugin ppVar9;
  long lVar10;
  ulong uVar11;
  size_t __size;
  char *pcVar12;
  ulong uVar13;
  bool bVar14;
  portability_working_path_length cwd_path_str_length;
  portability_working_path_str cwd_path_str;
  ulong local_1050;
  long local_1048;
  loader_manager_impl local_1040;
  char local_1038 [4104];
  
  __ptr = (loader_manager_impl)malloc(0x28);
  if (__ptr == (loader_manager_impl)0x0) {
    log_write_impl_va("metacall",0x86,"loader_manager_impl_initialize",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_manager_impl.c"
                      ,3,"Loader failed to allocate its implementation");
  }
  else {
    pvVar3 = (vector)vector_create(0x18);
    __ptr->initialization_order = pvVar3;
    if (pvVar3 == (vector)0x0) {
      log_write_impl_va("metacall",0x8e,"loader_manager_impl_initialize",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_manager_impl.c"
                        ,3,"Loader failed to allocate the initialization order vector");
    }
    else {
      psVar4 = (set)set_create(hash_callback_ptr);
      __ptr->destroy_map = psVar4;
      if (psVar4 == (set)0x0) {
        log_write_impl_va("metacall",0x96,"loader_manager_impl_initialize",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_manager_impl.c"
                          ,3,"Loader failed to allocate the destroy map");
      }
      else {
        memset(local_1038,0,0x1000);
        local_1048 = 0;
        local_1050 = 0;
        pvVar5 = (vector)vector_create(8);
        pvVar3 = (vector)0x0;
        if (pvVar5 != (vector)0x0) {
          iVar2 = portability_working_path(local_1038,&local_1048);
          if (iVar2 == 0) {
            lVar10 = local_1048 + 1;
            pcVar12 = local_1038;
          }
          else {
            pcVar12 = ".";
            lVar10 = 2;
          }
          local_1040 = __ptr;
          lVar10 = environment_variable_path_create("LOADER_SCRIPT_PATH",pcVar12,lVar10,&local_1050)
          ;
          log_write_impl_va("metacall",0x50,"loader_manager_impl_script_paths_initialize",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_manager_impl.c"
                            ,0,"Loader script path: %s",lVar10);
          if (local_1050 != 0) {
            uVar11 = 0;
            uVar13 = 1;
            do {
              cVar1 = *(char *)(lVar10 + -1 + uVar13);
              if ((cVar1 == ':') || (cVar1 == '\0')) {
                *(undefined1 *)(lVar10 + -1 + uVar13) = 0;
                vector_push_back_empty(pvVar5);
                puVar6 = (undefined8 *)vector_back(pvVar5);
                __size = uVar13 - uVar11;
                pvVar7 = malloc(__size);
                *puVar6 = pvVar7;
                if (pvVar7 == (void *)0x0) {
                  log_write_impl_va("metacall",0x62,"loader_manager_impl_script_paths_initialize",
                                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_manager_impl.c"
                                    ,0,"Loader script path failed to allocate: %s",uVar11 + lVar10);
                  uVar11 = uVar13;
                }
                else {
                  portability_path_canonical(uVar11 + lVar10,__size,pvVar7,__size);
                  uVar11 = uVar13;
                }
              }
              bVar14 = uVar13 < local_1050;
              uVar13 = uVar13 + 1;
            } while (bVar14);
          }
          environment_variable_path_destroy(lVar10);
          __ptr = local_1040;
          pvVar3 = pvVar5;
        }
        __ptr->script_paths = pvVar3;
        if (pvVar3 == (vector)0x0) {
          log_write_impl_va("metacall",0x9e,"loader_manager_impl_initialize",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_manager_impl.c"
                            ,3,"Loader failed to initialize the script paths");
        }
        else {
          uVar8 = thread_id_get_current();
          __ptr->init_thread_id = uVar8;
          ppVar9 = loader_host_initialize();
          __ptr->host = ppVar9;
          if (ppVar9 != (plugin)0x0) {
            return __ptr;
          }
          log_write_impl_va("metacall",0xa8,"loader_manager_impl_initialize",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_manager_impl.c"
                            ,3,"Loader failed to initialize the host loader");
          loader_manager_impl_script_paths_destroy(pvVar3);
        }
        set_destroy(__ptr->destroy_map);
      }
      vector_destroy(__ptr->initialization_order);
    }
    free(__ptr);
  }
  return (loader_manager_impl)0x0;
}

Assistant:

loader_manager_impl loader_manager_impl_initialize(void)
{
	loader_manager_impl manager_impl = malloc(sizeof(struct loader_manager_impl_type));

	if (manager_impl == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader failed to allocate its implementation");
		goto alloc_error;
	}

	manager_impl->initialization_order = vector_create(sizeof(struct loader_initialization_order_type));

	if (manager_impl->initialization_order == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader failed to allocate the initialization order vector");
		goto initialization_order_error;
	}

	manager_impl->destroy_map = set_create(&hash_callback_ptr, &comparable_callback_ptr);

	if (manager_impl->destroy_map == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader failed to allocate the destroy map");
		goto destroy_map_error;
	}

	manager_impl->script_paths = loader_manager_impl_script_paths_initialize();

	if (manager_impl->script_paths == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader failed to initialize the script paths");
		goto script_paths_error;
	}

	manager_impl->init_thread_id = thread_id_get_current();

	manager_impl->host = loader_host_initialize();

	if (manager_impl->host == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader failed to initialize the host loader");
		goto host_error;
	}

	return manager_impl;

host_error:
	loader_manager_impl_script_paths_destroy(manager_impl->script_paths);
script_paths_error:
	set_destroy(manager_impl->destroy_map);
destroy_map_error:
	vector_destroy(manager_impl->initialization_order);
initialization_order_error:
	free(manager_impl);
alloc_error:
	return NULL;
}